

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primeextractor.cpp
# Opt level: O0

void __thiscall PrimeExtractor::extract(PrimeExtractor *this)

{
  ulong uVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  reference local_30;
  ulong local_20;
  long i;
  long step;
  PrimeExtractor *this_local;
  
  step = (long)this;
  i = findNextStep(this);
  do {
    iterateVector(this,i);
    i = findNextStep(this);
    bVar2 = false;
    if (0 < i) {
      bVar2 = i <= this->stopSqrt;
    }
  } while (bVar2);
  if (1 < this->stop) {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,2);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  local_20 = 1;
  while( true ) {
    uVar1 = local_20;
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size(&this->primeCand);
    if (sVar4 <= uVar1) break;
    local_30 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->primeCand,local_20);
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_30);
    if (bVar2) {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_20 * 2 + 1);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void PrimeExtractor::extract()
{
    long step = this->findNextStep();
    
    do {
      this->iterateVector(step);
      step = this->findNextStep();
    } while (step > 0 && step <= this->stopSqrt);
    if (this->stop >=2) {
      /**
       * Note: with the procedure described above 2 will never be 
       * calculated but it's prime.
       **/
      std::cout << 2 << std::endl;
    }
    for(long i = 1; i < this->primeCand.size() ; i++) {
      if (this->primeCand[i] == true) {
	  std::cout << i * 2 + 1 << std::endl;
      } 
	
    }
}